

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_avx2.c
# Opt level: O2

void aom_lowbd_blend_a64_d16_mask_avx2
               (uint8_t *dst,uint32_t dst_stride,CONV_BUF_TYPE *src0,uint32_t src0_stride,
               CONV_BUF_TYPE *src1,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,
               int h,int subw,int subh,ConvolveParams *conv_params)

{
  undefined1 auVar1 [32];
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  int j;
  long lVar11;
  char cVar12;
  int iVar13;
  uint shift;
  int iVar14;
  int j_1;
  int j_2;
  uint8_t *puVar15;
  ulong *puVar16;
  ulong *puVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  __m256i m0;
  __m128i v_maxval;
  __m128i v_round_offset;
  __m256i y_round_offset;
  ulong *local_1c8;
  ulong *local_1c0;
  undefined1 (*local_1b8) [32];
  uint8_t *local_1a8;
  undefined1 local_190;
  undefined1 uStack_18f;
  undefined1 uStack_18e;
  undefined1 uStack_18d;
  __m256i local_140;
  longlong local_120 [4];
  undefined1 local_100;
  undefined1 uStack_ff;
  undefined1 uStack_fe;
  undefined1 uStack_fd;
  undefined1 uStack_fc;
  undefined1 uStack_fb;
  undefined1 uStack_fa;
  undefined1 uStack_f9;
  undefined1 uStack_f8;
  undefined1 uStack_f7;
  undefined1 uStack_f6;
  undefined1 uStack_f5;
  undefined1 uStack_f4;
  undefined1 uStack_f3;
  undefined1 uStack_f2;
  undefined1 uStack_f1;
  undefined1 uStack_f0;
  undefined1 uStack_ef;
  undefined1 uStack_ee;
  undefined1 uStack_ed;
  undefined1 uStack_ec;
  undefined1 uStack_eb;
  undefined1 uStack_ea;
  undefined1 uStack_e9;
  undefined1 uStack_e8;
  undefined1 uStack_e7;
  undefined1 uStack_e6;
  undefined1 uStack_e5;
  undefined1 uStack_e4;
  undefined1 uStack_e3;
  undefined1 uStack_e2;
  undefined1 uStack_e1;
  undefined4 local_e0;
  undefined2 uStack_dc;
  undefined2 uStack_da;
  undefined2 uStack_d8;
  undefined2 uStack_d6;
  undefined2 uStack_d4;
  undefined2 uStack_d2;
  undefined2 uStack_d0;
  undefined2 uStack_ce;
  undefined2 uStack_cc;
  undefined2 uStack_ca;
  undefined2 uStack_c8;
  undefined2 uStack_c6;
  undefined2 uStack_c4;
  undefined2 uStack_c2;
  __m128i local_b0;
  __m256i local_a0;
  __m256i local_80;
  long local_60;
  
  uVar2 = (ulong)src0_stride;
  iVar13 = conv_params->round_1 + conv_params->round_0;
  cVar12 = (char)iVar13;
  iVar14 = (-1 << (0xdU - cVar12 & 0x1f)) +
           (1 << (0x15U - cVar12 & 0x1f)) + (1 << (0x16U - cVar12 & 0x1f));
  shift = 0x14 - iVar13;
  iVar13 = iVar14 * 0x40;
  local_1b8 = (undefined1 (*) [32])mask;
  local_b0[0]._4_4_ = iVar13;
  local_b0[0]._0_4_ = iVar13;
  local_b0[1]._0_4_ = iVar13;
  local_b0[1]._4_4_ = iVar13;
  auVar24._4_4_ = iVar14;
  auVar24._0_4_ = iVar14;
  auVar24._8_4_ = iVar14;
  auVar24._12_4_ = iVar14;
  auVar24._16_4_ = iVar14;
  auVar24._20_4_ = iVar14;
  auVar24._24_4_ = iVar14;
  auVar24._28_4_ = iVar14;
  local_a0 = (__m256i)vpslld_avx2(auVar24,6);
  local_1c8 = (ulong *)src0;
  local_1c0 = (ulong *)src1;
  local_1a8 = dst;
  if (subh == 0 && subw == 0) {
    if (w == 0x10) {
      local_120[0] = 0x40004000400040;
      local_120[1] = 0x40004000400040;
      local_120[2] = 0x40004000400040;
      local_120[3] = 0x40004000400040;
      iVar13 = 0;
      if (0 < h) {
        iVar13 = h;
      }
      while (iVar13 != 0) {
        local_140 = (__m256i)vpmovzxbw_avx2(*(undefined1 (*) [16])*local_1b8);
        blend_a64_d16_mask_w16_avx2
                  (local_1a8,(CONV_BUF_TYPE *)local_1c8,(CONV_BUF_TYPE *)local_1c0,&local_140,
                   &local_a0,&local_120,shift);
        local_1b8 = (undefined1 (*) [32])(*local_1b8 + mask_stride);
        local_1a8 = local_1a8 + dst_stride;
        local_1c0 = (ulong *)((long)local_1c0 + (ulong)src1_stride * 2);
        local_1c8 = (ulong *)((long)local_1c8 + uVar2 * 2);
        iVar13 = iVar13 + -1;
      }
    }
    else if (w == 8) {
      local_120[0] = 0x40004000400040;
      local_120[1] = 0x40004000400040;
      iVar13 = 0;
      if (0 < h) {
        iVar13 = h;
      }
      while (iVar13 != 0) {
        auVar19._8_8_ = 0;
        auVar19._0_8_ = *(ulong *)*local_1b8;
        auVar19 = vpmovzxbw_avx(auVar19);
        local_140[0] = auVar19._0_8_;
        local_140[1] = auVar19._8_8_;
        blend_a64_d16_mask_w8_sse41
                  (local_1a8,(CONV_BUF_TYPE *)local_1c8,(CONV_BUF_TYPE *)local_1c0,
                   (__m128i *)local_140,&local_b0,(__m128i *)local_120,shift);
        local_1b8 = (undefined1 (*) [32])(*local_1b8 + mask_stride);
        local_1a8 = local_1a8 + dst_stride;
        local_1c0 = (ulong *)((long)local_1c0 + (ulong)src1_stride * 2);
        local_1c8 = (ulong *)((long)local_1c8 + uVar2 * 2);
        iVar13 = iVar13 + -1;
      }
    }
    else if (w == 4) {
      iVar13 = 0;
      if (0 < h) {
        iVar13 = h;
      }
      auVar21._8_2_ = 0x40;
      auVar21._0_8_ = 0x40004000400040;
      auVar21._10_2_ = 0x40;
      auVar21._12_2_ = 0x40;
      auVar21._14_2_ = 0x40;
      while (bVar18 = iVar13 != 0, iVar13 = iVar13 + -1, bVar18) {
        auVar19 = vpmovzxbw_avx(ZEXT416(*(uint *)*local_1b8));
        auVar31 = vpsubw_avx(auVar21,auVar19);
        auVar32._8_8_ = 0;
        auVar32._0_8_ = *local_1c8;
        auVar36._8_8_ = 0;
        auVar36._0_8_ = *local_1c0;
        auVar32 = vpunpcklwd_avx(auVar32,auVar36);
        auVar19 = vpunpcklwd_avx(auVar19,auVar31);
        auVar19 = vpmaddwd_avx(auVar32,auVar19);
        auVar19 = vpsubd_avx(auVar19,(undefined1  [16])local_b0);
        auVar19 = vpsrad_avx(auVar19,ZEXT416(shift));
        auVar19 = vpackssdw_avx(auVar19,auVar19);
        auVar19 = vpackuswb_avx(auVar19,auVar19);
        *(int *)local_1a8 = auVar19._0_4_;
        local_1b8 = (undefined1 (*) [32])(*local_1b8 + mask_stride);
        local_1a8 = local_1a8 + dst_stride;
        local_1c0 = (ulong *)((long)local_1c0 + (ulong)src1_stride * 2);
        local_1c8 = (ulong *)((long)local_1c8 + uVar2 * 2);
      }
    }
    else {
      local_120[0] = 0x40004000400040;
      local_120[1] = 0x40004000400040;
      local_120[2] = 0x40004000400040;
      local_120[3] = 0x40004000400040;
      iVar13 = 0;
      if (h < 1) {
        h = iVar13;
      }
      lVar11 = (ulong)src1_stride * 2;
      local_100 = (undefined1)lVar11;
      uStack_ff = (undefined1)((ulong)lVar11 >> 8);
      uStack_fe = (undefined1)((ulong)lVar11 >> 0x10);
      uStack_fd = (undefined1)((ulong)lVar11 >> 0x18);
      uStack_fc = (undefined1)((ulong)lVar11 >> 0x20);
      uStack_fb = 0;
      uStack_fa = 0;
      uStack_f9 = 0;
      for (; iVar13 != h; iVar13 = iVar13 + 1) {
        puVar16 = local_1c8;
        puVar17 = local_1c0;
        for (lVar11 = 0; lVar11 < w; lVar11 = lVar11 + 0x20) {
          local_140 = (__m256i)vpmovzxbw_avx2(*(undefined1 (*) [16])(*local_1b8 + lVar11));
          local_80 = (__m256i)vpmovzxbw_avx2(*(undefined1 (*) [16])(*local_1b8 + lVar11 + 0x10));
          blend_a64_d16_mask_w32_avx2
                    (local_1a8 + lVar11,(CONV_BUF_TYPE *)puVar16,(CONV_BUF_TYPE *)puVar17,&local_140
                     ,&local_80,&local_a0,&local_120,shift);
          puVar17 = (ulong *)((long)puVar17 + 0x40);
          puVar16 = (ulong *)((long)puVar16 + 0x40);
        }
        local_1b8 = (undefined1 (*) [32])(*local_1b8 + mask_stride);
        local_1a8 = local_1a8 + dst_stride;
        local_1c0 = (ulong *)((long)local_1c0 +
                             CONCAT17(uStack_f9,
                                      CONCAT16(uStack_fa,
                                               CONCAT15(uStack_fb,
                                                        CONCAT14(uStack_fc,
                                                                 CONCAT13(uStack_fd,
                                                                          CONCAT12(uStack_fe,
                                                                                   CONCAT11(
                                                  uStack_ff,local_100))))))));
        local_1c8 = (ulong *)((long)local_1c8 + uVar2 * 2);
      }
    }
  }
  else {
    local_100 = (undefined1)dst_stride;
    uStack_ff = (undefined1)(dst_stride >> 8);
    uStack_fe = (undefined1)(dst_stride >> 0x10);
    uStack_fd = (undefined1)(dst_stride >> 0x18);
    if (subh == 1 && (subw ^ 1U) == 0) {
      if (w == 0x10) {
        local_120[0] = 0x40004000400040;
        local_120[1] = 0x40004000400040;
        local_120[2] = 0x40004000400040;
        local_120[3] = 0x40004000400040;
        iVar13 = 0;
        if (0 < h) {
          iVar13 = h;
        }
        local_100 = 1;
        uStack_ff = 1;
        uStack_fe = 1;
        uStack_fd = 1;
        uStack_fc = 1;
        uStack_fb = 1;
        uStack_fa = 1;
        uStack_f9 = 1;
        uStack_f8 = 1;
        uStack_f7 = 1;
        uStack_f6 = 1;
        uStack_f5 = 1;
        uStack_f4 = 1;
        uStack_f3 = 1;
        uStack_f2 = 1;
        uStack_f1 = 1;
        uStack_f0 = 1;
        uStack_ef = 1;
        uStack_ee = 1;
        uStack_ed = 1;
        uStack_ec = 1;
        uStack_eb = 1;
        uStack_ea = 1;
        uStack_e9 = 1;
        uStack_e8 = 1;
        uStack_e7 = 1;
        uStack_e6 = 1;
        uStack_e5 = 1;
        uStack_e4 = 1;
        uStack_e3 = 1;
        uStack_e2 = 1;
        uStack_e1 = 1;
        local_e0._0_2_ = 2;
        local_e0._2_2_ = 2;
        uStack_dc = 2;
        uStack_da = 2;
        uStack_d8 = 2;
        uStack_d6 = 2;
        uStack_d4 = 2;
        uStack_d2 = 2;
        uStack_d0 = 2;
        uStack_ce = 2;
        uStack_cc = 2;
        uStack_ca = 2;
        uStack_c8 = 2;
        uStack_c6 = 2;
        uStack_c4 = 2;
        uStack_c2 = 2;
        while (bVar18 = iVar13 != 0, iVar13 = iVar13 + -1, bVar18) {
          auVar24 = vpaddusb_avx2(*local_1b8,*(undefined1 (*) [32])(*local_1b8 + mask_stride));
          auVar8[1] = uStack_ff;
          auVar8[0] = local_100;
          auVar8[2] = uStack_fe;
          auVar8[3] = uStack_fd;
          auVar8[4] = uStack_fc;
          auVar8[5] = uStack_fb;
          auVar8[6] = uStack_fa;
          auVar8[7] = uStack_f9;
          auVar8[8] = uStack_f8;
          auVar8[9] = uStack_f7;
          auVar8[10] = uStack_f6;
          auVar8[0xb] = uStack_f5;
          auVar8[0xc] = uStack_f4;
          auVar8[0xd] = uStack_f3;
          auVar8[0xe] = uStack_f2;
          auVar8[0xf] = uStack_f1;
          auVar8[0x10] = uStack_f0;
          auVar8[0x11] = uStack_ef;
          auVar8[0x12] = uStack_ee;
          auVar8[0x13] = uStack_ed;
          auVar8[0x14] = uStack_ec;
          auVar8[0x15] = uStack_eb;
          auVar8[0x16] = uStack_ea;
          auVar8[0x17] = uStack_e9;
          auVar8[0x18] = uStack_e8;
          auVar8[0x19] = uStack_e7;
          auVar8[0x1a] = uStack_e6;
          auVar8[0x1b] = uStack_e5;
          auVar8[0x1c] = uStack_e4;
          auVar8[0x1d] = uStack_e3;
          auVar8[0x1e] = uStack_e2;
          auVar8[0x1f] = uStack_e1;
          auVar24 = vpmaddubsw_avx2(auVar24,auVar8);
          auVar10._2_2_ = local_e0._2_2_;
          auVar10._0_2_ = (undefined2)local_e0;
          auVar10._4_2_ = uStack_dc;
          auVar10._6_2_ = uStack_da;
          auVar10._8_2_ = uStack_d8;
          auVar10._10_2_ = uStack_d6;
          auVar10._12_2_ = uStack_d4;
          auVar10._14_2_ = uStack_d2;
          auVar10._16_2_ = uStack_d0;
          auVar10._18_2_ = uStack_ce;
          auVar10._20_2_ = uStack_cc;
          auVar10._22_2_ = uStack_ca;
          auVar10._24_2_ = uStack_c8;
          auVar10._26_2_ = uStack_c6;
          auVar10._28_2_ = uStack_c4;
          auVar10._30_2_ = uStack_c2;
          auVar24 = vpaddw_avx2(auVar24,auVar10);
          local_140 = (__m256i)vpsrlw_avx2(auVar24,2);
          blend_a64_d16_mask_w16_avx2
                    (local_1a8,(CONV_BUF_TYPE *)local_1c8,(CONV_BUF_TYPE *)local_1c0,&local_140,
                     &local_a0,&local_120,shift);
          local_1b8 = (undefined1 (*) [32])(*local_1b8 + mask_stride * 2);
          local_1a8 = local_1a8 + dst_stride;
          local_1c0 = (ulong *)((long)local_1c0 + (ulong)src1_stride * 2);
          local_1c8 = (ulong *)((long)local_1c8 + uVar2 * 2);
        }
      }
      else if (w == 8) {
        local_120[0] = 0x40004000400040;
        local_120[1] = 0x40004000400040;
        iVar13 = 0;
        if (0 < h) {
          iVar13 = h;
        }
        local_100 = 1;
        uStack_ff = 1;
        uStack_fe = 1;
        uStack_fd = 1;
        uStack_fc = 1;
        uStack_fb = 1;
        uStack_fa = 1;
        uStack_f9 = 1;
        uStack_f8 = 1;
        uStack_f7 = 1;
        uStack_f6 = 1;
        uStack_f5 = 1;
        uStack_f4 = 1;
        uStack_f3 = 1;
        uStack_f2 = 1;
        uStack_f1 = 1;
        local_e0._0_2_ = 2;
        local_e0._2_2_ = 2;
        uStack_dc = 2;
        uStack_da = 2;
        uStack_d8 = 2;
        uStack_d6 = 2;
        uStack_d4 = 2;
        uStack_d2 = 2;
        while (bVar18 = iVar13 != 0, iVar13 = iVar13 + -1, bVar18) {
          auVar19 = vpaddusb_avx(*(undefined1 (*) [16])*local_1b8,
                                 *(undefined1 (*) [16])(*local_1b8 + mask_stride));
          auVar7[1] = uStack_ff;
          auVar7[0] = local_100;
          auVar7[2] = uStack_fe;
          auVar7[3] = uStack_fd;
          auVar7[4] = uStack_fc;
          auVar7[5] = uStack_fb;
          auVar7[6] = uStack_fa;
          auVar7[7] = uStack_f9;
          auVar7[8] = uStack_f8;
          auVar7[9] = uStack_f7;
          auVar7[10] = uStack_f6;
          auVar7[0xb] = uStack_f5;
          auVar7[0xc] = uStack_f4;
          auVar7[0xd] = uStack_f3;
          auVar7[0xe] = uStack_f2;
          auVar7[0xf] = uStack_f1;
          auVar19 = vpmaddubsw_avx(auVar19,auVar7);
          auVar9._2_2_ = local_e0._2_2_;
          auVar9._0_2_ = (undefined2)local_e0;
          auVar9._4_2_ = uStack_dc;
          auVar9._6_2_ = uStack_da;
          auVar9._8_2_ = uStack_d8;
          auVar9._10_2_ = uStack_d6;
          auVar9._12_2_ = uStack_d4;
          auVar9._14_2_ = uStack_d2;
          auVar19 = vpaddw_avx(auVar19,auVar9);
          auVar19 = vpsrlw_avx(auVar19,2);
          local_140[0] = auVar19._0_8_;
          local_140[1] = auVar19._8_8_;
          blend_a64_d16_mask_w8_sse41
                    (local_1a8,(CONV_BUF_TYPE *)local_1c8,(CONV_BUF_TYPE *)local_1c0,
                     (__m128i *)local_140,&local_b0,(__m128i *)local_120,shift);
          local_1b8 = (undefined1 (*) [32])(*local_1b8 + mask_stride * 2);
          local_1a8 = local_1a8 + dst_stride;
          local_1c0 = (ulong *)((long)local_1c0 + (ulong)src1_stride * 2);
          local_1c8 = (ulong *)((long)local_1c8 + uVar2 * 2);
        }
      }
      else if (w == 4) {
        iVar13 = 0;
        if (0 < h) {
          iVar13 = h;
        }
        auVar20[8] = 1;
        auVar20._0_8_ = 0x101010101010101;
        auVar20[9] = 1;
        auVar20[10] = 1;
        auVar20[0xb] = 1;
        auVar20[0xc] = 1;
        auVar20[0xd] = 1;
        auVar20[0xe] = 1;
        auVar20[0xf] = 1;
        auVar25._8_2_ = 2;
        auVar25._0_8_ = 0x2000200020002;
        auVar25._10_2_ = 2;
        auVar25._12_2_ = 2;
        auVar25._14_2_ = 2;
        auVar27._8_2_ = 0x40;
        auVar27._0_8_ = 0x40004000400040;
        auVar27._10_2_ = 0x40;
        auVar27._12_2_ = 0x40;
        auVar27._14_2_ = 0x40;
        while (bVar18 = iVar13 != 0, iVar13 = iVar13 + -1, bVar18) {
          auVar30._8_8_ = 0;
          auVar30._0_8_ = *(ulong *)*local_1b8;
          auVar35._8_8_ = 0;
          auVar35._0_8_ = *(ulong *)(*local_1b8 + mask_stride);
          auVar19 = vpaddusb_avx(auVar30,auVar35);
          auVar19 = vpmaddubsw_avx(auVar19,auVar20);
          auVar19 = vpaddw_avx(auVar19,auVar25);
          auVar31 = vpsrlw_avx(auVar19,2);
          auVar19 = vpsubw_avx(auVar27,auVar31);
          auVar38._8_8_ = 0;
          auVar38._0_8_ = *local_1c8;
          auVar41._8_8_ = 0;
          auVar41._0_8_ = *local_1c0;
          auVar21 = vpunpcklwd_avx(auVar38,auVar41);
          auVar19 = vpunpcklwd_avx(auVar31,auVar19);
          auVar19 = vpmaddwd_avx(auVar21,auVar19);
          auVar19 = vpsubd_avx(auVar19,(undefined1  [16])local_b0);
          auVar19 = vpsrad_avx(auVar19,ZEXT416(shift));
          auVar19 = vpackssdw_avx(auVar19,auVar19);
          auVar19 = vpackuswb_avx(auVar19,auVar19);
          *(int *)local_1a8 = auVar19._0_4_;
          local_1b8 = (undefined1 (*) [32])(*local_1b8 + mask_stride * 2);
          local_1a8 = local_1a8 + dst_stride;
          local_1c0 = (ulong *)((long)local_1c0 + (ulong)src1_stride * 2);
          local_1c8 = (ulong *)((long)local_1c8 + uVar2 * 2);
        }
      }
      else {
        local_120[0] = 0x40004000400040;
        local_120[1] = 0x40004000400040;
        local_120[2] = 0x40004000400040;
        local_120[3] = 0x40004000400040;
        uStack_fc = 0;
        uStack_fb = 0;
        uStack_fa = 0;
        uStack_f9 = 0;
        iVar13 = 0;
        if (h < 1) {
          h = 0;
        }
        local_60 = (ulong)src1_stride * 2;
        lVar11 = uVar2 * 2;
        local_e0._0_2_ = (undefined2)lVar11;
        local_e0._2_2_ = (undefined2)((ulong)lVar11 >> 0x10);
        uStack_dc = (undefined2)((ulong)lVar11 >> 0x20);
        uStack_da = 0;
        puVar15 = mask + (ulong)mask_stride + 0x20;
        for (; iVar13 != h; iVar13 = iVar13 + 1) {
          puVar16 = local_1c8;
          puVar17 = local_1c0;
          for (lVar11 = 0; lVar11 < w; lVar11 = lVar11 + 0x20) {
            auVar24 = vpaddusb_avx2(*(undefined1 (*) [32])(*local_1b8 + lVar11 * 2),
                                    *(undefined1 (*) [32])(puVar15 + lVar11 * 2 + -0x20));
            auVar1 = vpaddusb_avx2(*(undefined1 (*) [32])(local_1b8[1] + lVar11 * 2),
                                   *(undefined1 (*) [32])(puVar15 + lVar11 * 2));
            auVar5[8] = 1;
            auVar5._0_8_ = 0x101010101010101;
            auVar5[9] = 1;
            auVar5[10] = 1;
            auVar5[0xb] = 1;
            auVar5[0xc] = 1;
            auVar5[0xd] = 1;
            auVar5[0xe] = 1;
            auVar5[0xf] = 1;
            auVar5[0x10] = 1;
            auVar5[0x11] = 1;
            auVar5[0x12] = 1;
            auVar5[0x13] = 1;
            auVar5[0x14] = 1;
            auVar5[0x15] = 1;
            auVar5[0x16] = 1;
            auVar5[0x17] = 1;
            auVar5[0x18] = 1;
            auVar5[0x19] = 1;
            auVar5[0x1a] = 1;
            auVar5[0x1b] = 1;
            auVar5[0x1c] = 1;
            auVar5[0x1d] = 1;
            auVar5[0x1e] = 1;
            auVar5[0x1f] = 1;
            auVar24 = vpmaddubsw_avx2(auVar24,auVar5);
            auVar1 = vpmaddubsw_avx2(auVar1,auVar5);
            auVar4._8_2_ = 2;
            auVar4._0_8_ = 0x2000200020002;
            auVar4._10_2_ = 2;
            auVar4._12_2_ = 2;
            auVar4._14_2_ = 2;
            auVar4._16_2_ = 2;
            auVar4._18_2_ = 2;
            auVar4._20_2_ = 2;
            auVar4._22_2_ = 2;
            auVar4._24_2_ = 2;
            auVar4._26_2_ = 2;
            auVar4._28_2_ = 2;
            auVar4._30_2_ = 2;
            auVar24 = vpaddw_avx2(auVar24,auVar4);
            local_140 = (__m256i)vpsrlw_avx2(auVar24,2);
            auVar24 = vpaddw_avx2(auVar1,auVar4);
            local_80 = (__m256i)vpsrlw_avx2(auVar24,2);
            blend_a64_d16_mask_w32_avx2
                      (local_1a8 + lVar11,(CONV_BUF_TYPE *)puVar16,(CONV_BUF_TYPE *)puVar17,
                       &local_140,&local_80,&local_a0,&local_120,shift);
            puVar17 = (ulong *)((long)puVar17 + 0x40);
            puVar16 = (ulong *)((long)puVar16 + 0x40);
          }
          local_1b8 = (undefined1 (*) [32])(*local_1b8 + mask_stride * 2);
          local_1a8 = local_1a8 +
                      CONCAT17(uStack_f9,
                               CONCAT16(uStack_fa,
                                        CONCAT15(uStack_fb,
                                                 CONCAT14(uStack_fc,
                                                          CONCAT13(uStack_fd,
                                                                   CONCAT12(uStack_fe,
                                                                            CONCAT11(uStack_ff,
                                                                                     local_100))))))
                              );
          local_1c0 = (ulong *)((long)local_1c0 + local_60);
          local_1c8 = (ulong *)((long)local_1c8 +
                               CONCAT26(uStack_da,
                                        CONCAT24(uStack_dc,
                                                 CONCAT22(local_e0._2_2_,(undefined2)local_e0))));
          puVar15 = puVar15 + mask_stride * 2;
        }
      }
    }
    else {
      local_190 = (undefined1)src0_stride;
      uStack_18f = (undefined1)(src0_stride >> 8);
      uStack_18e = (undefined1)(src0_stride >> 0x10);
      uStack_18d = (undefined1)(src0_stride >> 0x18);
      if ((subw ^ 1U) == 0 && subh == 0) {
        if (w == 0x10) {
          local_120[0] = 0x40004000400040;
          local_120[1] = 0x40004000400040;
          local_120[2] = 0x40004000400040;
          local_120[3] = 0x40004000400040;
          local_100 = (undefined1)src1_stride;
          uStack_ff = (undefined1)(src1_stride >> 8);
          uStack_fe = (undefined1)(src1_stride >> 0x10);
          uStack_fd = (undefined1)(src1_stride >> 0x18);
          uStack_fc = 0;
          uStack_fb = 0;
          uStack_fa = 0;
          uStack_f9 = 0;
          iVar13 = 0;
          if (h < 1) {
            h = iVar13;
          }
          for (; iVar13 != h; iVar13 = iVar13 + 1) {
            bVar18 = true;
            lVar11 = 0;
            while (bVar18) {
              auVar1[8] = 1;
              auVar1._0_8_ = 0x101010101010101;
              auVar1[9] = 1;
              auVar1[10] = 1;
              auVar1[0xb] = 1;
              auVar1[0xc] = 1;
              auVar1[0xd] = 1;
              auVar1[0xe] = 1;
              auVar1[0xf] = 1;
              auVar1[0x10] = 1;
              auVar1[0x11] = 1;
              auVar1[0x12] = 1;
              auVar1[0x13] = 1;
              auVar1[0x14] = 1;
              auVar1[0x15] = 1;
              auVar1[0x16] = 1;
              auVar1[0x17] = 1;
              auVar1[0x18] = 1;
              auVar1[0x19] = 1;
              auVar1[0x1a] = 1;
              auVar1[0x1b] = 1;
              auVar1[0x1c] = 1;
              auVar1[0x1d] = 1;
              auVar1[0x1e] = 1;
              auVar1[0x1f] = 1;
              auVar24 = vpmaddubsw_avx2(*local_1b8,auVar1);
              local_140 = (__m256i)vpavgw_avx2(auVar24,_DAT_0046a360);
              blend_a64_d16_mask_w16_avx2
                        (local_1a8 + lVar11,(CONV_BUF_TYPE *)((long)local_1c8 + lVar11 * 2),
                         (CONV_BUF_TYPE *)((long)local_1c0 + lVar11 * 2),&local_140,&local_a0,
                         &local_120,shift);
              bVar18 = false;
              lVar11 = 0x10;
            }
            local_1b8 = (undefined1 (*) [32])(*local_1b8 + mask_stride);
            local_1a8 = local_1a8 + dst_stride;
            local_1c8 = (ulong *)((long)local_1c8 + (ulong)src0_stride * 2);
            local_1c0 = (ulong *)((long)local_1c0 +
                                 CONCAT17(uStack_f9,
                                          CONCAT16(uStack_fa,
                                                   CONCAT15(uStack_fb,
                                                            CONCAT14(uStack_fc,
                                                                     CONCAT13(uStack_fd,
                                                                              CONCAT12(uStack_fe,
                                                                                       CONCAT11(
                                                  uStack_ff,local_100))))))) * 2);
          }
        }
        else if (w == 8) {
          local_120[0] = 0x40004000400040;
          local_120[1] = 0x40004000400040;
          iVar13 = 0;
          if (0 < h) {
            iVar13 = h;
          }
          while (bVar18 = iVar13 != 0, iVar13 = iVar13 + -1, bVar18) {
            auVar3[8] = 1;
            auVar3._0_8_ = 0x101010101010101;
            auVar3[9] = 1;
            auVar3[10] = 1;
            auVar3[0xb] = 1;
            auVar3[0xc] = 1;
            auVar3[0xd] = 1;
            auVar3[0xe] = 1;
            auVar3[0xf] = 1;
            auVar19 = vpmaddubsw_avx(*(undefined1 (*) [16])*local_1b8,auVar3);
            auVar19 = vpavgw_avx(auVar19,_DAT_00424030);
            local_140[0] = auVar19._0_8_;
            local_140[1] = auVar19._8_8_;
            blend_a64_d16_mask_w8_sse41
                      (local_1a8,(CONV_BUF_TYPE *)local_1c8,(CONV_BUF_TYPE *)local_1c0,
                       (__m128i *)local_140,&local_b0,(__m128i *)local_120,shift);
            local_1b8 = (undefined1 (*) [32])(*local_1b8 + mask_stride);
            local_1a8 = local_1a8 + dst_stride;
            local_1c0 = (ulong *)((long)local_1c0 + (ulong)src1_stride * 2);
            local_1c8 = (ulong *)((long)local_1c8 + uVar2 * 2);
          }
        }
        else if (w == 4) {
          iVar13 = 0;
          if (0 < h) {
            iVar13 = h;
          }
          auVar22[8] = 1;
          auVar22._0_8_ = 0x101010101010101;
          auVar22[9] = 1;
          auVar22[10] = 1;
          auVar22[0xb] = 1;
          auVar22[0xc] = 1;
          auVar22[0xd] = 1;
          auVar22[0xe] = 1;
          auVar22[0xf] = 1;
          auVar28._8_2_ = 0x40;
          auVar28._0_8_ = 0x40004000400040;
          auVar28._10_2_ = 0x40;
          auVar28._12_2_ = 0x40;
          auVar28._14_2_ = 0x40;
          while (bVar18 = iVar13 != 0, iVar13 = iVar13 + -1, bVar18) {
            auVar33._8_8_ = 0;
            auVar33._0_8_ = *(ulong *)*local_1b8;
            auVar19 = vpmaddubsw_avx(auVar33,auVar22);
            auVar19 = vpavgw_avx(auVar19,(undefined1  [16])0x0);
            auVar21 = vpsubw_avx(auVar28,auVar19);
            auVar39._8_8_ = 0;
            auVar39._0_8_ = *local_1c8;
            auVar42._8_8_ = 0;
            auVar42._0_8_ = *local_1c0;
            auVar31 = vpunpcklwd_avx(auVar39,auVar42);
            auVar19 = vpunpcklwd_avx(auVar19,auVar21);
            auVar19 = vpmaddwd_avx(auVar31,auVar19);
            auVar19 = vpsubd_avx(auVar19,(undefined1  [16])local_b0);
            auVar19 = vpsrad_avx(auVar19,ZEXT416(shift));
            auVar19 = vpackssdw_avx(auVar19,auVar19);
            auVar19 = vpackuswb_avx(auVar19,auVar19);
            *(int *)local_1a8 = auVar19._0_4_;
            local_1b8 = (undefined1 (*) [32])(*local_1b8 + mask_stride);
            local_1a8 = local_1a8 + dst_stride;
            local_1c0 = (ulong *)((long)local_1c0 + (ulong)src1_stride * 2);
            local_1c8 = (ulong *)((long)local_1c8 + uVar2 * 2);
          }
        }
        else {
          local_120[0] = 0x40004000400040;
          local_120[1] = 0x40004000400040;
          local_120[2] = 0x40004000400040;
          local_120[3] = 0x40004000400040;
          iVar13 = 0;
          if (h < 1) {
            h = iVar13;
          }
          lVar11 = (ulong)src1_stride * 2;
          local_e0._0_2_ = (undefined2)lVar11;
          local_e0._2_2_ = (undefined2)((ulong)lVar11 >> 0x10);
          uStack_dc = (undefined2)((ulong)lVar11 >> 0x20);
          uStack_da = 0;
          lVar11 = uVar2 * 2;
          local_100 = (undefined1)lVar11;
          uStack_ff = (undefined1)((ulong)lVar11 >> 8);
          uStack_fe = (undefined1)((ulong)lVar11 >> 0x10);
          uStack_fd = (undefined1)((ulong)lVar11 >> 0x18);
          uStack_fc = (undefined1)((ulong)lVar11 >> 0x20);
          uStack_fb = 0;
          uStack_fa = 0;
          uStack_f9 = 0;
          for (; iVar13 != h; iVar13 = iVar13 + 1) {
            puVar16 = local_1c8;
            puVar17 = local_1c0;
            for (lVar11 = 0; lVar11 < w; lVar11 = lVar11 + 0x20) {
              auVar6[8] = 1;
              auVar6._0_8_ = 0x101010101010101;
              auVar6[9] = 1;
              auVar6[10] = 1;
              auVar6[0xb] = 1;
              auVar6[0xc] = 1;
              auVar6[0xd] = 1;
              auVar6[0xe] = 1;
              auVar6[0xf] = 1;
              auVar6[0x10] = 1;
              auVar6[0x11] = 1;
              auVar6[0x12] = 1;
              auVar6[0x13] = 1;
              auVar6[0x14] = 1;
              auVar6[0x15] = 1;
              auVar6[0x16] = 1;
              auVar6[0x17] = 1;
              auVar6[0x18] = 1;
              auVar6[0x19] = 1;
              auVar6[0x1a] = 1;
              auVar6[0x1b] = 1;
              auVar6[0x1c] = 1;
              auVar6[0x1d] = 1;
              auVar6[0x1e] = 1;
              auVar6[0x1f] = 1;
              auVar24 = vpmaddubsw_avx2(*(undefined1 (*) [32])(*local_1b8 + lVar11 * 2),auVar6);
              auVar1 = vpmaddubsw_avx2(*(undefined1 (*) [32])(local_1b8[1] + lVar11 * 2),auVar6);
              local_140 = (__m256i)vpavgw_avx2(auVar24,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
              local_80 = (__m256i)vpavgw_avx2(auVar1,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
              blend_a64_d16_mask_w32_avx2
                        (local_1a8 + lVar11,(CONV_BUF_TYPE *)puVar16,(CONV_BUF_TYPE *)puVar17,
                         &local_140,&local_80,&local_a0,&local_120,shift);
              puVar17 = (ulong *)((long)puVar17 + 0x40);
              puVar16 = (ulong *)((long)puVar16 + 0x40);
            }
            local_1b8 = (undefined1 (*) [32])(*local_1b8 + mask_stride);
            local_1a8 = local_1a8 + dst_stride;
            local_1c0 = (ulong *)((long)local_1c0 +
                                 CONCAT26(uStack_da,
                                          CONCAT24(uStack_dc,
                                                   CONCAT22(local_e0._2_2_,(undefined2)local_e0))));
            local_1c8 = (ulong *)((long)local_1c8 +
                                 CONCAT17(uStack_f9,
                                          CONCAT16(uStack_fa,
                                                   CONCAT15(uStack_fb,
                                                            CONCAT14(uStack_fc,
                                                                     CONCAT13(uStack_fd,
                                                                              CONCAT12(uStack_fe,
                                                                                       CONCAT11(
                                                  uStack_ff,local_100))))))));
          }
        }
      }
      else if (w == 0x10) {
        local_120[0] = 0x40004000400040;
        local_120[1] = 0x40004000400040;
        local_120[2] = 0x40004000400040;
        local_120[3] = 0x40004000400040;
        uStack_fc = 0;
        uStack_fb = 0;
        uStack_fa = 0;
        uStack_f9 = 0;
        uStack_dc = 0;
        uStack_da = 0;
        iVar13 = 0;
        if (h < 1) {
          h = 0;
        }
        local_100 = local_190;
        uStack_ff = uStack_18f;
        uStack_fe = uStack_18e;
        uStack_fd = uStack_18d;
        for (; iVar13 != h; iVar13 = iVar13 + 1) {
          bVar18 = true;
          lVar11 = 0;
          while (bVar18) {
            auVar19 = vpaddusb_avx(*(undefined1 (*) [16])(*local_1b8 + lVar11),
                                   *(undefined1 (*) [16])(*local_1b8 + lVar11 + (ulong)mask_stride))
            ;
            auVar19 = vpavgb_avx(auVar19,_DAT_00424030);
            local_140 = (__m256i)vpmovzxbw_avx2(auVar19);
            local_e0 = src1_stride;
            blend_a64_d16_mask_w16_avx2
                      (local_1a8 + lVar11,(CONV_BUF_TYPE *)((long)local_1c8 + lVar11 * 2),
                       (CONV_BUF_TYPE *)((long)local_1c0 + lVar11 * 2),&local_140,&local_a0,
                       &local_120,shift);
            bVar18 = false;
            lVar11 = 0x10;
            src1_stride = local_e0;
          }
          local_1b8 = (undefined1 (*) [32])(*local_1b8 + mask_stride * 2);
          local_1a8 = local_1a8 + dst_stride;
          local_1c8 = (ulong *)((long)local_1c8 +
                               CONCAT17(uStack_f9,
                                        CONCAT16(uStack_fa,
                                                 CONCAT15(uStack_fb,
                                                          CONCAT14(uStack_fc,
                                                                   CONCAT13(uStack_fd,
                                                                            CONCAT12(uStack_fe,
                                                                                     CONCAT11(
                                                  uStack_ff,local_100))))))) * 2);
          local_1c0 = (ulong *)((long)local_1c0 +
                               CONCAT26(uStack_da,CONCAT24(uStack_dc,src1_stride)) * 2);
        }
      }
      else if (w == 8) {
        local_120[0] = 0x40004000400040;
        local_120[1] = 0x40004000400040;
        iVar13 = 0;
        if (0 < h) {
          iVar13 = h;
        }
        while (iVar13 != 0) {
          auVar31._8_8_ = 0;
          auVar31._0_8_ = *(ulong *)*local_1b8;
          auVar23._8_8_ = 0;
          auVar23._0_8_ = *(ulong *)(*local_1b8 + mask_stride);
          auVar19 = vpaddusb_avx(auVar31,auVar23);
          auVar19 = vpavgb_avx(auVar19,_DAT_00424030);
          auVar19 = vpmovzxbw_avx(auVar19);
          local_140[0] = auVar19._0_8_;
          local_140[1] = auVar19._8_8_;
          blend_a64_d16_mask_w8_sse41
                    (local_1a8,(CONV_BUF_TYPE *)local_1c8,(CONV_BUF_TYPE *)local_1c0,
                     (__m128i *)local_140,&local_b0,(__m128i *)local_120,shift);
          local_1b8 = (undefined1 (*) [32])(*local_1b8 + mask_stride * 2);
          local_1a8 = local_1a8 + dst_stride;
          local_1c0 = (ulong *)((long)local_1c0 + (ulong)src1_stride * 2);
          local_1c8 = (ulong *)((long)local_1c8 + uVar2 * 2);
          iVar13 = iVar13 + -1;
        }
      }
      else if (w == 4) {
        iVar13 = 0;
        if (0 < h) {
          iVar13 = h;
        }
        auVar26._8_2_ = 0x40;
        auVar26._0_8_ = 0x40004000400040;
        auVar26._10_2_ = 0x40;
        auVar26._12_2_ = 0x40;
        auVar26._14_2_ = 0x40;
        while (bVar18 = iVar13 != 0, iVar13 = iVar13 + -1, bVar18) {
          auVar29._8_8_ = 0;
          auVar29._0_8_ = *(ulong *)*local_1b8;
          auVar34._8_8_ = 0;
          auVar34._0_8_ = *(ulong *)(*local_1b8 + mask_stride);
          auVar19 = vpaddusb_avx(auVar29,auVar34);
          auVar19 = vpavgb_avx(auVar19,(undefined1  [16])0x0);
          auVar19 = vpmovzxbw_avx(auVar19);
          auVar21 = vpsubw_avx(auVar26,auVar19);
          auVar37._8_8_ = 0;
          auVar37._0_8_ = *local_1c8;
          auVar40._8_8_ = 0;
          auVar40._0_8_ = *local_1c0;
          auVar31 = vpunpcklwd_avx(auVar37,auVar40);
          auVar19 = vpunpcklwd_avx(auVar19,auVar21);
          auVar19 = vpmaddwd_avx(auVar31,auVar19);
          auVar19 = vpsubd_avx(auVar19,(undefined1  [16])local_b0);
          auVar19 = vpsrad_avx(auVar19,ZEXT416(shift));
          auVar19 = vpackssdw_avx(auVar19,auVar19);
          auVar19 = vpackuswb_avx(auVar19,auVar19);
          *(int *)local_1a8 = auVar19._0_4_;
          local_1b8 = (undefined1 (*) [32])(*local_1b8 + mask_stride * 2);
          local_1a8 = local_1a8 + dst_stride;
          local_1c0 = (ulong *)((long)local_1c0 + (ulong)src1_stride * 2);
          local_1c8 = (ulong *)((long)local_1c8 + uVar2 * 2);
        }
      }
      else {
        local_120[0] = 0x40004000400040;
        local_120[1] = 0x40004000400040;
        local_120[2] = 0x40004000400040;
        local_120[3] = 0x40004000400040;
        iVar13 = 0;
        if (h < 1) {
          h = 0;
        }
        lVar11 = (ulong)src1_stride * 2;
        local_100 = (undefined1)lVar11;
        uStack_ff = (undefined1)((ulong)lVar11 >> 8);
        uStack_fe = (undefined1)((ulong)lVar11 >> 0x10);
        uStack_fd = (undefined1)((ulong)lVar11 >> 0x18);
        uStack_fc = (undefined1)((ulong)lVar11 >> 0x20);
        uStack_fb = 0;
        uStack_fa = 0;
        uStack_f9 = 0;
        puVar15 = mask + mask_stride;
        for (; iVar13 != h; iVar13 = iVar13 + 1) {
          puVar16 = local_1c8;
          puVar17 = local_1c0;
          for (lVar11 = 0; lVar11 < w; lVar11 = lVar11 + 0x20) {
            auVar24 = vpaddusb_avx2(*(undefined1 (*) [32])(*local_1b8 + lVar11),
                                    *(undefined1 (*) [32])(puVar15 + lVar11));
            auVar24 = vpavgb_avx2(auVar24,_DAT_0046a360);
            local_140 = (__m256i)vpmovzxbw_avx2(auVar24._0_16_);
            local_80 = (__m256i)vpmovzxbw_avx2(auVar24._16_16_);
            blend_a64_d16_mask_w32_avx2
                      (local_1a8 + lVar11,(CONV_BUF_TYPE *)puVar16,(CONV_BUF_TYPE *)puVar17,
                       &local_140,&local_80,&local_a0,&local_120,shift);
            puVar17 = (ulong *)((long)puVar17 + 0x40);
            puVar16 = (ulong *)((long)puVar16 + 0x40);
          }
          local_1b8 = (undefined1 (*) [32])(*local_1b8 + mask_stride * 2);
          local_1a8 = local_1a8 + dst_stride;
          local_1c0 = (ulong *)((long)local_1c0 +
                               CONCAT17(uStack_f9,
                                        CONCAT16(uStack_fa,
                                                 CONCAT15(uStack_fb,
                                                          CONCAT14(uStack_fc,
                                                                   CONCAT13(uStack_fd,
                                                                            CONCAT12(uStack_fe,
                                                                                     CONCAT11(
                                                  uStack_ff,local_100))))))));
          local_1c8 = (ulong *)((long)local_1c8 + uVar2 * 2);
          puVar15 = puVar15 + mask_stride * 2;
        }
      }
    }
  }
  return;
}

Assistant:

void aom_lowbd_blend_a64_d16_mask_avx2(
    uint8_t *dst, uint32_t dst_stride, const CONV_BUF_TYPE *src0,
    uint32_t src0_stride, const CONV_BUF_TYPE *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h, int subw, int subh,
    ConvolveParams *conv_params) {
  const int bd = 8;
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;

  const int round_offset =
      ((1 << (round_bits + bd)) + (1 << (round_bits + bd - 1)) -
       (1 << (round_bits - 1)))
      << AOM_BLEND_A64_ROUND_BITS;

  const int shift = round_bits + AOM_BLEND_A64_ROUND_BITS;
  assert(IMPLIES((void *)src0 == dst, src0_stride == dst_stride));
  assert(IMPLIES((void *)src1 == dst, src1_stride == dst_stride));

  assert(h >= 4);
  assert(w >= 4);
  assert(IS_POWER_OF_TWO(h));
  assert(IS_POWER_OF_TWO(w));
  const __m128i v_round_offset = _mm_set1_epi32(round_offset);
  const __m256i y_round_offset = _mm256_set1_epi32(round_offset);

  if (subw == 0 && subh == 0) {
    switch (w) {
      case 4:
        aom_lowbd_blend_a64_d16_mask_subw0_subh0_w4_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift);
        break;
      case 8:
        aom_lowbd_blend_a64_d16_mask_subw0_subh0_w8_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift);
        break;
      case 16:
        lowbd_blend_a64_d16_mask_subw0_subh0_w16_avx2(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &y_round_offset, shift);
        break;
      default:
        lowbd_blend_a64_d16_mask_subw0_subh0_w32_avx2(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, w, &y_round_offset, shift);
        break;
    }
  } else if (subw == 1 && subh == 1) {
    switch (w) {
      case 4:
        aom_lowbd_blend_a64_d16_mask_subw1_subh1_w4_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift);
        break;
      case 8:
        aom_lowbd_blend_a64_d16_mask_subw1_subh1_w8_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift);
        break;
      case 16:
        lowbd_blend_a64_d16_mask_subw1_subh1_w16_avx2(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &y_round_offset, shift);
        break;
      default:
        lowbd_blend_a64_d16_mask_subw1_subh1_w32_avx2(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, w, &y_round_offset, shift);
        break;
    }
  } else if (subw == 1 && subh == 0) {
    switch (w) {
      case 4:
        aom_lowbd_blend_a64_d16_mask_subw1_subh0_w4_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift);
        break;
      case 8:
        aom_lowbd_blend_a64_d16_mask_subw1_subh0_w8_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift);
        break;
      case 16:
        lowbd_blend_a64_d16_mask_subw1_subh0_w16_avx2(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, w, &y_round_offset, shift);
        break;
      default:
        lowbd_blend_a64_d16_mask_subw1_subh0_w32_avx2(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, w, &y_round_offset, shift);
        break;
    }
  } else {
    switch (w) {
      case 4:
        aom_lowbd_blend_a64_d16_mask_subw0_subh1_w4_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift);
        break;
      case 8:
        aom_lowbd_blend_a64_d16_mask_subw0_subh1_w8_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift);
        break;
      case 16:
        lowbd_blend_a64_d16_mask_subw0_subh1_w16_avx2(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, w, &y_round_offset, shift);
        break;
      default:
        lowbd_blend_a64_d16_mask_subw0_subh1_w32_avx2(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, w, &y_round_offset, shift);
        break;
    }
  }
}